

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivisor.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverDivisor(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cover_t *pKernel;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 < 2) {
    pCover_local = (Mvc_Cover_t *)0x0;
  }
  else {
    iVar1 = Mvc_CoverAnyLiteral(pCover,(Mvc_Cube_t *)0x0);
    if (iVar1 == -1) {
      pCover_local = (Mvc_Cover_t *)0x0;
    }
    else {
      pCover_local = Mvc_CoverDup(pCover);
      Mvc_CoverDivisorZeroKernel(pCover_local);
      iVar1 = Mvc_CoverReadCubeNum(pCover_local);
      if (iVar1 == 0) {
        __assert_fail("Mvc_CoverReadCubeNum(pKernel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivisor.c"
                      ,0x3a,"Mvc_Cover_t *Mvc_CoverDivisor(Mvc_Cover_t *)");
      }
    }
  }
  return pCover_local;
}

Assistant:

Mvc_Cover_t * Mvc_CoverDivisor( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pKernel;
    if ( Mvc_CoverReadCubeNum(pCover) <= 1 )
        return NULL;
    // allocate the literal array and count literals
    if ( Mvc_CoverAnyLiteral( pCover, NULL ) == -1 )
        return NULL;
    // duplicate the cover
    pKernel = Mvc_CoverDup(pCover);
    // perform the kerneling
    Mvc_CoverDivisorZeroKernel( pKernel );
    assert( Mvc_CoverReadCubeNum(pKernel) );
    return pKernel;
}